

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenio::save_elements(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char outelefilename [1024];
  
  sprintf(outelefilename,"%s.ele",filebasename);
  printf("Saving elements to %s\n",outelefilename);
  __stream = fopen(outelefilename,"w");
  if (this->mesh_dim == 3) {
    fprintf(__stream,"%d  %d  %d\n",(ulong)(uint)this->numberoftetrahedra,
            (ulong)(uint)this->numberofcorners,(ulong)(uint)this->numberoftetrahedronattributes);
    for (iVar4 = 0; iVar4 < this->numberoftetrahedra; iVar4 = iVar4 + 1) {
      fprintf(__stream,"%d",(ulong)(uint)(this->firstnumber + iVar4));
      for (iVar1 = 0; iVar1 < this->numberofcorners; iVar1 = iVar1 + 1) {
        fprintf(__stream,"  %5d",
                (ulong)(uint)this->tetrahedronlist[this->numberofcorners * iVar4 + iVar1]);
      }
      for (iVar1 = 0; iVar1 < this->numberoftetrahedronattributes; iVar1 = iVar1 + 1) {
        fprintf(__stream,"  %g",
                this->tetrahedronattributelist[this->numberoftetrahedronattributes * iVar4 + iVar1])
        ;
      }
      fputc(10,__stream);
    }
  }
  else {
    fprintf(__stream,"%d  %d  %d\n",(ulong)(uint)this->numberoftrifaces,3,
            (ulong)(this->trifacemarkerlist != (int *)0x0));
    lVar3 = 0;
    for (lVar5 = 0; lVar5 < this->numberoftrifaces; lVar5 = lVar5 + 1) {
      fprintf(__stream,"%d",(ulong)(uint)(this->firstnumber + (int)lVar5));
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        fprintf(__stream,"  %5d",(ulong)*(uint *)((long)this->trifacelist + lVar2 * 4 + lVar3));
      }
      if (this->trifacemarkerlist != (int *)0x0) {
        fprintf(__stream,"  %d",(ulong)(uint)this->trifacemarkerlist[lVar5]);
      }
      fputc(10,__stream);
      lVar3 = lVar3 + 0xc;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_elements(char* filebasename)
{
  FILE *fout;
  char outelefilename[FILENAMESIZE];
  int i, j;

  sprintf(outelefilename, "%s.ele", filebasename);
  printf("Saving elements to %s\n", outelefilename);
  fout = fopen(outelefilename, "w");
  if (mesh_dim == 3) {
    fprintf(fout, "%d  %d  %d\n", numberoftetrahedra, numberofcorners,
            numberoftetrahedronattributes);
    for (i = 0; i < numberoftetrahedra; i++) {
      fprintf(fout, "%d", i + firstnumber);
      for (j = 0; j < numberofcorners; j++) {
        fprintf(fout, "  %5d", tetrahedronlist[i * numberofcorners + j]);
      }
      for (j = 0; j < numberoftetrahedronattributes; j++) {
        fprintf(fout, "  %g",
          tetrahedronattributelist[i * numberoftetrahedronattributes + j]);
      }
      fprintf(fout, "\n");
    }
  } else {
    // Save a two-dimensional mesh.
    fprintf(fout, "%d  %d  %d\n",numberoftrifaces,3,trifacemarkerlist ? 1 : 0);
    for (i = 0; i < numberoftrifaces; i++) {
      fprintf(fout, "%d", i + firstnumber);
      for (j = 0; j < 3; j++) {
        fprintf(fout, "  %5d", trifacelist[i * 3 + j]);
      }
      if (trifacemarkerlist != NULL) {
        fprintf(fout, "  %d", trifacemarkerlist[i]);
      }
      fprintf(fout, "\n");
    }
  }

  fclose(fout);
}